

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::~cmMakefile(cmMakefile *this)

{
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&(this->WarnedCMP0074)._M_t);
  std::vector<BT<cmMakefile::GeneratorAction>,_std::allocator<BT<cmMakefile::GeneratorAction>_>_>::
  ~vector(&this->GeneratorActions);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->ImportedTargets)._M_h);
  std::
  vector<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>,_std::allocator<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>_>_>
  ::~vector(&this->ImportedTargetsOwned);
  std::_Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>::~_Vector_base
            (&(this->ExecutionStatusStack).
              super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>);
  std::
  vector<std::unique_ptr<cmGeneratorExpressionEvaluationFile,_std::default_delete<cmGeneratorExpressionEvaluationFile>_>,_std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluationFile,_std::default_delete<cmGeneratorExpressionEvaluationFile>_>_>_>
  ::~vector(&this->EvaluationFiles);
  std::
  vector<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>,_std::allocator<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_>_>
  ::~vector(&this->ExportBuildFileGenerators);
  std::_Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>::~_Vector_base
            (&(this->UnConfiguredDirectories).
              super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>);
  cmsys::RegularExpression::~RegularExpression(&this->cmNamedCurly);
  cmsys::RegularExpression::~RegularExpression(&this->cmAtVarRegex);
  cmsys::RegularExpression::~RegularExpression(&this->cmDefine01Regex);
  cmsys::RegularExpression::~RegularExpression(&this->cmDefineRegex);
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base
            ((_Deque_base<int,_std::allocator<int>_> *)&this->LoopBlockCounter);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->FunctionBlockerBarriers).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::
  vector<std::unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>,_std::allocator<std::unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>_>_>
  ::~vector(&(this->FunctionBlockers).c);
  std::_Function_base::~_Function_base(&(this->ExecuteCommandCallback).super__Function_base);
  std::unique_ptr<cmMakefile::DeferCommands,_std::default_delete<cmMakefile::DeferCommands>_>::
  ~unique_ptr(&this->Defer);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::~vector(&this->SourceGroups);
  std::__cxx11::string::~string((string *)&this->DefineFlagsOrig);
  std::__cxx11::string::~string((string *)&this->DefineFlags);
  std::__cxx11::string::~string((string *)&this->ComplainFileRegularExpression);
  std::
  vector<std::unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_>,_std::allocator<std::unique_ptr<cmTestGenerator,_std::default_delete<cmTestGenerator>_>_>_>
  ::~vector(&this->TestGenerators);
  std::
  vector<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>,_std::allocator<std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>_>_>
  ::~vector(&this->InstallGenerators);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->OutputFiles);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->ListFiles);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&(this->SystemIncludeDirectories)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cmTest,_std::default_delete<cmTest>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cmTest,_std::default_delete<cmTest>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<cmTest,_std::default_delete<cmTest>_>_>_>_>
  ::~_Rb_tree(&(this->Tests)._M_t);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->KnownFileSearchIndex)._M_h);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->SourceFileSearchIndex)._M_h);
  std::
  vector<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>,_std::allocator<std::unique_ptr<cmSourceFile,_std::default_delete<cmSourceFile>_>_>_>
  ::~vector(&this->SourceFiles);
  std::_Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>::~_Vector_base
            (&(this->OrderedTargets).super__Vector_base<cmTarget_*,_std::allocator<cmTarget_*>_>);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&(this->AliasTargets)._M_t);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->Targets)._M_h);
  std::
  _Rb_tree<cmListFileContext,_cmListFileContext,_std::_Identity<cmListFileContext>,_std::less<cmListFileContext>,_std::allocator<cmListFileContext>_>
  ::~_Rb_tree(&(this->CMP0054ReportedIds)._M_t);
  std::
  deque<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~deque(&this->FindPackageRootPathStack);
  return;
}

Assistant:

cmMakefile::~cmMakefile() = default;